

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O2

bool __thiscall
QNetworkCookieJar::validateCookie(QNetworkCookieJar *this,QNetworkCookie *cookie,QUrl *url)

{
  QStringView domain;
  char16_t *pcVar1;
  qsizetype qVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QStringView domain_00;
  QStringView domain_01;
  QStringView reference;
  QStringView reference_00;
  QStringView local_88;
  QArrayDataPointer<char16_t> local_78;
  QStringView local_58;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCookie::domain((QString *)&local_48,cookie);
  qVar2 = local_48.size;
  pcVar1 = local_48.ptr;
  local_58.m_size = local_48.size;
  local_58.m_data = local_48.ptr;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  QUrl::host(&local_78,url,0x7f00000);
  reference.m_data._4_4_ = local_78.ptr._4_4_;
  reference.m_data._0_4_ = local_78.ptr._0_4_;
  domain_00.m_data = pcVar1;
  domain_00.m_size = qVar2;
  reference.m_size = local_78.size;
  bVar3 = isParentDomain(domain_00,reference);
  if (!bVar3) {
    domain_01.m_data._4_4_ = local_78.ptr._4_4_;
    domain_01.m_data._0_4_ = local_78.ptr._0_4_;
    domain_01.m_size = local_78.size;
    reference_00.m_data = pcVar1;
    reference_00.m_size = qVar2;
    bVar3 = isParentDomain(domain_01,reference_00);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_001838de;
    }
  }
  if (((undefined1 *)qVar2 != (undefined1 *)0x0) && (*pcVar1 == L'.')) {
    local_58.m_data = pcVar1 + 1;
    local_58.m_size = qVar2 + -1;
  }
  local_88.m_data = (storage_type_conflict *)CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
  local_88.m_size = local_78.size;
  bVar4 = comparesEqual(&local_88,&local_58);
  bVar3 = true;
  if (!bVar4) {
    domain.m_data = local_58.m_data;
    domain.m_size = local_58.m_size;
    bVar3 = qIsEffectiveTLD(domain);
    bVar3 = !bVar3;
  }
LAB_001838de:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkCookieJar::validateCookie(const QNetworkCookie &cookie, const QUrl &url) const
{
    const QString cookieDomain = cookie.domain();
    QStringView domain = cookieDomain;
    const QString host = url.host();
    if (!isParentDomain(domain, host) && !isParentDomain(host, domain))
        return false; // not accepted

    if (domain.startsWith(u'.'))
        domain = domain.sliced(1);

    // We shouldn't reject if:
    // "[...] the domain-attribute is identical to the canonicalized request-host"
    // https://tools.ietf.org/html/rfc6265#section-5.3 step 5
    if (host == domain)
        return true;
    // the check for effective TLDs makes the "embedded dot" rule from RFC 2109 section 4.3.2
    // redundant; the "leading dot" rule has been relaxed anyway, see QNetworkCookie::normalize()
    // we remove the leading dot for this check if it's present
    // Normally defined in qtldurl_p.h, but uses fall-back in this file when topleveldomain isn't
    // configured:
    return !qIsEffectiveTLD(domain);
}